

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_palette.hpp
# Opt level: O1

ByteArray * __thiscall
ColorPalette<6UL>::to_bytes(ByteArray *__return_storage_ptr__,ColorPalette<6UL> *this)

{
  uint16_t uVar1;
  undefined8 in_RAX;
  long lVar2;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lVar2 = 0;
  uStack_38 = in_RAX;
  do {
    uVar1 = Color::to_bgr_word((Color *)(&(this->super_array<Color,_6UL>)._M_elems[0]._r + lVar2));
    uStack_38._0_7_ = CONCAT16((char)(uVar1 >> 8),(undefined6)uStack_38);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
               (uchar *)((long)&uStack_38 + 6));
    uStack_38 = CONCAT17((char)uVar1,(undefined7)uStack_38);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
               (uchar *)((long)&uStack_38 + 7));
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x18);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] ByteArray to_bytes() const
    {
        ByteArray bytes;
        for(const Color& color : *this)
            bytes.add_word(color.to_bgr_word());
        return bytes;
    }